

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O1

void __thiscall
mp::SPAdapter::GetVarStages<mp::BasicSuffix<int>>(SPAdapter *this,BasicSuffix<int> stage_suffix)

{
  int *piVar1;
  pointer piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)((long)(this->problem_->super_Problem).vars_.
                               super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->problem_->super_Problem).vars_.
                              super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      piVar2 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar2[uVar5] == 0) {
        uVar3 = *(uint *)(*(long *)((long)stage_suffix.super_SuffixBase.impl_ + 0x18) + uVar5 * 4);
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        piVar2[uVar5] = uVar3 - 1;
        if ((int)((ulong)((long)(this->num_stage_vars_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) < (int)uVar3) {
          std::vector<int,_std::allocator<int>_>::resize(&this->num_stage_vars_,(ulong)uVar3);
        }
        piVar1 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar3 - 1);
        *piVar1 = *piVar1 + 1;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  return;
}

Assistant:

void SPAdapter::GetVarStages(Suffix stage_suffix) {
  // Count the number of variables in each stage and temporarily store variable
  // stages in var_orig2core_.
  for (int i = 0, n = problem_.num_vars(); i < n; ++i) {
    if (var_orig2core_[i])
      continue;  // Skip random variables.
    int stage = std::max(stage_suffix.value(i) - 1, 0);
    var_orig2core_[i] = stage;
    if (stage >= static_cast<int>(num_stage_vars_.size()))
      num_stage_vars_.resize(stage + 1);
    ++num_stage_vars_[stage];
  }
}